

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiFile.cpp
# Opt level: O2

void __thiscall smf::MidiFile::deleteTrack(MidiFile *this,int aTrack)

{
  pointer ppMVar1;
  MidiEventList *this_00;
  ulong uVar2;
  int iVar3;
  ulong uVar4;
  
  ppMVar1 = (this->m_events).
            super__Vector_base<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  uVar4 = (ulong)((long)(this->m_events).
                        super__Vector_base<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>
                        ._M_impl.super__Vector_impl_data._M_finish - (long)ppMVar1) >> 3;
  iVar3 = (int)uVar4;
  if (iVar3 != 1) {
    if ((-1 < aTrack) && (aTrack < iVar3)) {
      this_00 = ppMVar1[(uint)aTrack];
      if (this_00 != (MidiEventList *)0x0) {
        MidiEventList::~MidiEventList(this_00);
      }
      operator_delete(this_00);
      uVar2 = (ulong)(uint)aTrack;
      while( true ) {
        ppMVar1 = (this->m_events).
                  super__Vector_base<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        if ((int)(iVar3 - 1U) <= aTrack) break;
        ppMVar1[uVar2] = ppMVar1[uVar2 + 1];
        aTrack = aTrack + 1;
        uVar2 = uVar2 + 1;
      }
      ppMVar1[uVar4 & 0xffffffff] = (MidiEventList *)0x0;
      std::vector<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>::resize
                (&this->m_events,(ulong)(iVar3 - 1U));
      return;
    }
  }
  return;
}

Assistant:

void MidiFile::splitTracks(void) {
	if (getTrackState() == TRACK_STATE_SPLIT) {
		return;
	}
	int oldTimeState = getTickState();
	if (oldTimeState == TIME_STATE_DELTA) {
		makeAbsoluteTicks();
	}

	int maxTrack = 0;
	int i;
	int length = m_events[0]->size();
	for (i=0; i<length; i++) {
		if ((*m_events[0])[i].track > maxTrack) {
			maxTrack = (*m_events[0])[i].track;
		}
	}
	int m_trackCount = maxTrack + 1;

	if (m_trackCount <= 1) {
		return;
	}

	MidiEventList* olddata = m_events[0];
	m_events[0] = NULL;
	m_events.resize(m_trackCount);
	for (i=0; i<m_trackCount; i++) {
		m_events[i] = new MidiEventList;
	}

	for (i=0; i<length; i++) {
		int trackValue = (*olddata)[i].track;
		m_events[trackValue]->push_back_no_copy(&(*olddata)[i]);
	}

	olddata->detach();
	delete olddata;

	if (oldTimeState == TIME_STATE_DELTA) {
		makeDeltaTicks();
	}

	m_theTrackState = TRACK_STATE_SPLIT;
}